

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

void __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::instantiate(ModuleRunnerBase<wasm::ModuleRunner> *this)

{
  ExternalInterface *pEVar1;
  Module *pMVar2;
  Name name;
  bool bVar3;
  ModuleRunner *pMVar4;
  Literals local_d0;
  size_t local_98;
  char *pcStack_90;
  Literals local_88;
  undefined1 local_50 [8];
  Literals arguments;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  (*this->externalInterface->_vptr_ExternalInterface[3])
            (this->externalInterface,&this->globals,this->wasm);
  arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  ModuleUtils::
  iterDefinedGlobals<wasm::ModuleRunnerBase<wasm::ModuleRunner>::instantiate()::_lambda(wasm::Global*)_1_>
            (this->wasm,(anon_class_8_1_8991fb9c)this);
  pEVar1 = this->externalInterface;
  pMVar2 = this->wasm;
  pMVar4 = self(this);
  (*pEVar1->_vptr_ExternalInterface[2])(pEVar1,pMVar2,pMVar4);
  initializeTableContents(this);
  initializeMemoryContents(this);
  bVar3 = IString::is(&(this->wasm->start).super_IString);
  if (bVar3) {
    Literals::Literals((Literals *)local_50);
    local_98 = (this->wasm->start).super_IString.str._M_len;
    pcStack_90 = (this->wasm->start).super_IString.str._M_str;
    Literals::Literals(&local_d0,(Literals *)local_50);
    name.super_IString.str._M_str = pcStack_90;
    name.super_IString.str._M_len = local_98;
    callFunction(&local_88,this,name,&local_d0);
    Literals::~Literals(&local_88);
    Literals::~Literals(&local_d0);
    Literals::~Literals((Literals *)local_50);
  }
  return;
}

Assistant:

void instantiate() {
    // import globals from the outside
    externalInterface->importGlobals(globals, wasm);
    // generate internal (non-imported) globals
    ModuleUtils::iterDefinedGlobals(wasm, [&](Global* global) {
      globals[global->name] = self()->visit(global->init).values;
    });

    // initialize the rest of the external interface
    externalInterface->init(wasm, *self());

    initializeTableContents();
    initializeMemoryContents();

    // run start, if present
    if (wasm.start.is()) {
      Literals arguments;
      callFunction(wasm.start, arguments);
    }
  }